

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall CConnman::~CConnman(CConnman *this)

{
  long lVar1;
  _List_node_base *p_Var2;
  pointer ppCVar3;
  _List_node_base *p_Var4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Interrupt(this);
  StopThreads(this);
  StopNodes(this);
  std::__cxx11::_List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
  ::_M_clear(&(this->m_reconnections).
              super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
            );
  std::
  deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
  ::~deque(&(this->m_unused_i2p_sessions).c);
  std::vector<CService,_std::allocator<CService>_>::~vector(&this->m_onion_binds);
  if (((((this->threadI2PAcceptIncoming)._M_id._M_thread != 0) ||
       ((this->threadMessageHandler)._M_id._M_thread != 0)) ||
      ((this->threadOpenConnections)._M_id._M_thread != 0)) ||
     ((((this->threadOpenAddedConnections)._M_id._M_thread != 0 ||
       ((this->threadSocketHandler)._M_id._M_thread != 0)) ||
      ((this->threadDNSAddressSeed)._M_id._M_thread != 0)))) {
    std::terminate();
  }
  std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
            (&this->m_i2p_sam_session);
  std::condition_variable::~condition_variable(&(this->interruptNet).cond);
  std::condition_variable::~condition_variable(&this->condMsgProc);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&this->m_anchors);
  std::unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_>::~unique_ptr(&this->semAddnode);
  std::unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_>::~unique_ptr(&this->semOutbound);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_CConnman::CachedAddrResponse>,_std::_Select1st<std::pair<const_unsigned_long,_CConnman::CachedAddrResponse>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CConnman::CachedAddrResponse>_>_>
  ::~_Rb_tree(&(this->m_addr_response_caches)._M_t);
  p_Var4 = (this->m_nodes_disconnected).super__List_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var4 != (_List_node_base *)&this->m_nodes_disconnected) {
    p_Var2 = p_Var4->_M_next;
    operator_delete(p_Var4,0x18);
    p_Var4 = p_Var2;
  }
  ppCVar3 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppCVar3 != (pointer)0x0) {
    operator_delete(ppCVar3,(long)(this->m_nodes).
                                  super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppCVar3);
  }
  std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>::~vector
            (&this->m_added_node_params);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&this->m_addr_fetches);
  std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>::~vector
            (&this->vhListenSocket);
  std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::~vector
            (&this->vWhitelistedRangeOutgoing);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::~vector
            (&this->vWhitelistedRangeIncoming);
  return;
}

Assistant:

CConnman::~CConnman()
{
    Interrupt();
    Stop();
}